

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O3

void __thiscall cppcms::impl::tcp_cache_service::session::handle_error(session *this,error_code *e)

{
  error_category *peVar1;
  error_category *peVar2;
  char cVar3;
  level_type lVar4;
  int iVar5;
  ostream *poVar6;
  char *local_78;
  long local_70;
  char local_68 [16];
  message local_58 [48];
  
  peVar2 = booster::aio::aio_error_cat;
  peVar1 = e->_M_cat;
  iVar5 = e->_M_value;
  lVar4 = booster::log::logger::instance();
  if ((peVar1 == peVar2) && (iVar5 == 3)) {
    cVar3 = booster::log::logger::should_be_logged(lVar4,(char *)0x46);
    if (cVar3 == '\0') {
      return;
    }
    booster::log::message::message
              (local_58,debug,"cppcms_scale",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/tcp_cache_server.cpp"
               ,0xeb);
    poVar6 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Client disconnected, fd=",0x18);
    iVar5 = booster::aio::basic_io_device::native();
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"; ",2);
    (**(code **)(*(long *)e->_M_cat + 0x20))(&local_78,e->_M_cat,e->_M_value);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_78,local_70);
  }
  else {
    cVar3 = booster::log::logger::should_be_logged(lVar4,(char *)0x28);
    if (cVar3 == '\0') {
      return;
    }
    booster::log::message::message
              (local_58,warning,"cppcms_scale",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/tcp_cache_server.cpp"
               ,0xef);
    poVar6 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Error on connection, fd=",0x18);
    iVar5 = booster::aio::basic_io_device::native();
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"; ",2);
    (**(code **)(*(long *)e->_M_cat + 0x20))(&local_78,e->_M_cat,e->_M_value);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_78,local_70);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  booster::log::message::~message(local_58);
  return;
}

Assistant:

void handle_error(booster::system::error_code const &e)
	{
		if(e.category() == booster::aio::aio_error_cat && e.value() == booster::aio::aio_error::eof) {
			BOOSTER_DEBUG("cppcms_scale") << "Client disconnected, fd=" << socket_.native() 
				<<"; " << e.message();
			return;
		}
		BOOSTER_WARNING("cppcms_scale") << "Error on connection, fd=" << socket_.native() 
				<<"; " << e.message();
	}